

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O2

string * __thiscall
czh::utils::fill_double_abi_cxx11_(string *__return_storage_ptr__,utils *this,double v)

{
  int K;
  string buffer;
  int local_4c;
  string local_48;
  string local_28;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  grisu2(v,&local_48,&local_4c);
  prettify_string(&local_28,&local_48,local_4c);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p == &local_28.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_28.field_2._M_allocated_capacity._1_7_,local_28.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_28.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_28._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_28.field_2._M_allocated_capacity._1_7_,local_28.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_28._M_string_length;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string fill_double(double v)
  {
    int K;
    std::string buffer;
    grisu2(v, buffer, K);
    return std::move(prettify_string(buffer, K));
  }